

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 *pIVar9;
  ulong uVar10;
  int iVar11;
  ImDrawListSharedData *pIVar12;
  ImVec2 *pIVar13;
  uint vtx_count;
  int iVar14;
  ImDrawVert *pIVar15;
  byte bVar16;
  ImDrawIdx IVar17;
  ulong uVar18;
  ulong uVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  ulong uVar22;
  ImDrawIdx IVar23;
  ImDrawIdx IVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ImDrawIdx IVar29;
  bool bVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar37;
  float fVar38;
  ImVec2 IVar33;
  ImVec2 IVar34;
  ImVec2 IVar35;
  ImVec2 IVar36;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  
  if (1 < points_count) {
    uVar21 = points_count - 1;
    IVar2 = this->_Data->TexUvWhitePixel;
    uVar26 = points_count;
    if ((flags & 1U) == 0) {
      uVar26 = uVar21;
    }
    uVar28 = (ulong)uVar26;
    if ((this->Flags & 1U) == 0) {
      PrimReserve(this,uVar26 * 6,uVar26 * 4);
      uVar18 = 1;
      do {
        uVar10 = uVar18 & 0xffffffff;
        if ((uint)points_count == uVar18) {
          uVar10 = 0;
        }
        fVar38 = points[uVar18 - 1].x;
        fVar32 = points[uVar10].x - fVar38;
        fVar37 = points[uVar10].y - points[uVar18 - 1].y;
        fVar39 = fVar32 * fVar32 + fVar37 * fVar37;
        if (0.0 < fVar39) {
          fVar39 = 1.0 / SQRT(fVar39);
          fVar32 = fVar32 * fVar39;
          fVar37 = fVar37 * fVar39;
        }
        fVar32 = thickness * 0.5 * fVar32;
        fVar37 = fVar37 * thickness * 0.5;
        (this->_VtxWritePtr->pos).x = fVar38 + fVar37;
        (this->_VtxWritePtr->pos).y = points[uVar18 - 1].y - fVar32;
        this->_VtxWritePtr->uv = IVar2;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = points[uVar10].x + fVar37;
        this->_VtxWritePtr[1].pos.y = points[uVar10].y - fVar32;
        this->_VtxWritePtr[1].uv = IVar2;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos.x = points[uVar10].x - fVar37;
        this->_VtxWritePtr[2].pos.y = points[uVar10].y + fVar32;
        this->_VtxWritePtr[2].uv = IVar2;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos.x = points[uVar18 - 1].x - fVar37;
        this->_VtxWritePtr[3].pos.y = fVar32 + points[uVar18 - 1].y;
        this->_VtxWritePtr[3].uv = IVar2;
        this->_VtxWritePtr[3].col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 4;
        *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + 1;
        this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[3] = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[4] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[5] = (short)this->_VtxCurrentIdx + 3;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
        bVar30 = uVar18 != uVar28;
        uVar18 = uVar18 + 1;
      } while (bVar30);
    }
    else {
      fVar32 = thickness;
      if (thickness <= 1.0) {
        fVar32 = 1.0;
      }
      iVar11 = (int)fVar32;
      fVar37 = this->_FringeScale;
      bVar16 = fVar37 == 1.0 & iVar11 < 0x3f & (byte)this->Flags >> 1 &
               fVar32 - (float)iVar11 <= 1e-05;
      iVar25 = 0x12;
      if (thickness <= fVar37) {
        iVar25 = 0xc;
      }
      iVar14 = 6;
      if (bVar16 == 0) {
        iVar14 = iVar25;
      }
      if (bVar16 == 1) {
        vtx_count = points_count * 2;
        iVar25 = 3;
      }
      else {
        vtx_count = points_count * 3;
        if (fVar37 < thickness) {
          vtx_count = points_count * 4;
        }
        iVar25 = (uint)(fVar37 < thickness) * 2 + 3;
      }
      PrimReserve(this,iVar14 * uVar26,vtx_count);
      pIVar12 = this->_Data;
      uVar26 = iVar25 * points_count;
      if ((pIVar12->TempBuffer).Capacity < (int)uVar26) {
        pIVar9 = (pIVar12->TempBuffer).Data;
        if (pIVar9 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar9);
        }
        pIVar9 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar26 << 3);
        (pIVar12->TempBuffer).Data = pIVar9;
        (pIVar12->TempBuffer).Capacity = uVar26;
        pIVar12 = this->_Data;
      }
      uVar26 = col & 0xffffff;
      pIVar13 = (pIVar12->TempBuffer).Data;
      uVar10 = (ulong)(uint)points_count;
      pIVar9 = pIVar13 + uVar10;
      uVar18 = 1;
      do {
        uVar22 = uVar18 & 0xffffffff;
        if (uVar10 == uVar18) {
          uVar22 = 0;
        }
        fVar39 = points[uVar22].x - points[uVar18 - 1].x;
        fVar38 = points[uVar22].y - points[uVar18 - 1].y;
        fVar40 = fVar39 * fVar39 + fVar38 * fVar38;
        if (0.0 < fVar40) {
          fVar40 = 1.0 / SQRT(fVar40);
          fVar39 = fVar39 * fVar40;
          fVar38 = fVar38 * fVar40;
        }
        pIVar13[uVar18 - 1].x = fVar38;
        pIVar13[uVar18 - 1].y = -fVar39;
        bVar30 = uVar18 != uVar28;
        uVar18 = uVar18 + 1;
      } while (bVar30);
      if ((flags & 1U) == 0) {
        pIVar13[uVar21] = pIVar9[-2];
        if (thickness <= fVar37 || bVar16 != 0) {
          if (bVar16 != 0) {
            fVar37 = fVar32 * 0.5 + 1.0;
          }
          fVar32 = (*pIVar13).x * fVar37;
          fVar39 = (*pIVar13).y * fVar37;
          IVar33.x = (*points).x + fVar32;
          IVar33.y = (*points).y + fVar39;
          *pIVar9 = IVar33;
          IVar34.x = (*points).x - fVar32;
          IVar34.y = (*points).y - fVar39;
          pIVar9[1] = IVar34;
          IVar35.x = points[uVar21].x + pIVar13[uVar21].x * fVar37;
          IVar35.y = points[uVar21].y + pIVar13[uVar21].y * fVar37;
          pIVar9[uVar21 * 2] = IVar35;
          IVar4.y = points[uVar21].y - pIVar13[uVar21].y * fVar37;
          IVar4.x = points[uVar21].x - pIVar13[uVar21].x * fVar37;
          pIVar9[(ulong)(uVar21 * 2) + 1] = IVar4;
LAB_00200625:
          uVar18 = 1;
          uVar21 = this->_VtxCurrentIdx;
LAB_0020064e:
          uVar22 = uVar18 & 0xffffffff;
          if (uVar10 == uVar18) {
            uVar22 = 0;
          }
          uVar27 = uVar21 + (bVar16 ^ 3);
          if (uVar10 == uVar18) {
            uVar27 = this->_VtxCurrentIdx;
          }
          fVar32 = (pIVar13[uVar22].x + pIVar13[uVar18 - 1].x) * 0.5;
          fVar39 = (pIVar13[uVar22].y + pIVar13[uVar18 - 1].y) * 0.5;
          fVar38 = fVar32 * fVar32 + fVar39 * fVar39;
          if (1e-06 < fVar38) {
            fVar38 = 1.0 / fVar38;
            fVar40 = 100.0;
            if (fVar38 <= 100.0) {
              fVar40 = fVar38;
            }
            fVar32 = fVar32 * fVar40;
            fVar39 = fVar39 * fVar40;
          }
          uVar19 = (ulong)(uint)((int)uVar22 * 2);
          pIVar9[uVar19].x = points[uVar22].x + fVar37 * fVar32;
          pIVar9[uVar19].y = points[uVar22].y + fVar39 * fVar37;
          pIVar9[uVar19 + 1].x = points[uVar22].x - fVar37 * fVar32;
          pIVar9[uVar19 + 1].y = points[uVar22].y - fVar39 * fVar37;
          IVar23 = (ImDrawIdx)uVar27;
          *this->_IdxWritePtr = IVar23;
          IVar20 = (ImDrawIdx)uVar21;
          this->_IdxWritePtr[1] = IVar20;
          if (bVar16 == 0) {
            this->_IdxWritePtr[2] = IVar20 + 2;
            this->_IdxWritePtr[3] = IVar20 + 2;
            this->_IdxWritePtr[4] = IVar23 + 2;
            this->_IdxWritePtr[5] = IVar23;
            this->_IdxWritePtr[6] = IVar23 + 1;
            this->_IdxWritePtr[7] = IVar20 + 1;
            this->_IdxWritePtr[8] = IVar20;
            this->_IdxWritePtr[9] = IVar20;
            this->_IdxWritePtr[10] = IVar23;
            this->_IdxWritePtr[0xb] = IVar23 + 1;
            this->_IdxWritePtr = this->_IdxWritePtr + 0xc;
            if (uVar28 != uVar18) goto LAB_002007d8;
            pIVar15 = this->_VtxWritePtr;
            pIVar13 = pIVar13 + uVar10 + 1;
            uVar28 = 0;
            do {
              pIVar15->pos = points[uVar28];
              this->_VtxWritePtr->uv = IVar2;
              this->_VtxWritePtr->col = col;
              this->_VtxWritePtr[1].pos = pIVar13[-1];
              this->_VtxWritePtr[1].uv = IVar2;
              this->_VtxWritePtr[1].col = uVar26;
              this->_VtxWritePtr[2].pos = *pIVar13;
              this->_VtxWritePtr[2].uv = IVar2;
              this->_VtxWritePtr[2].col = uVar26;
              pIVar15 = this->_VtxWritePtr + 3;
              this->_VtxWritePtr = pIVar15;
              uVar28 = uVar28 + 1;
              pIVar13 = pIVar13 + 2;
            } while (uVar10 != uVar28);
          }
          else {
            this->_IdxWritePtr[2] = IVar20 + 1;
            this->_IdxWritePtr[3] = IVar23 + 1;
            this->_IdxWritePtr[4] = IVar20 + 1;
            this->_IdxWritePtr[5] = IVar23;
            this->_IdxWritePtr = this->_IdxWritePtr + 6;
            if (uVar28 != uVar18) goto LAB_002007d8;
            pIVar15 = this->_VtxWritePtr;
            pIVar3 = this->_Data->TexUvLines;
            pIVar1 = pIVar3 + iVar11;
            fVar32 = pIVar1->x;
            fVar37 = pIVar1->y;
            pIVar3 = pIVar3 + iVar11;
            fVar39 = pIVar3->z;
            fVar38 = pIVar3->w;
            pIVar13 = pIVar13 + uVar10 + 1;
            do {
              pIVar15->pos = pIVar13[-1];
              pIVar15 = this->_VtxWritePtr;
              (pIVar15->uv).x = fVar32;
              (pIVar15->uv).y = fVar37;
              this->_VtxWritePtr->col = col;
              this->_VtxWritePtr[1].pos = *pIVar13;
              pIVar15 = this->_VtxWritePtr;
              pIVar15[1].uv.x = fVar39;
              pIVar15[1].uv.y = fVar38;
              this->_VtxWritePtr[1].col = col;
              pIVar15 = this->_VtxWritePtr + 2;
              this->_VtxWritePtr = pIVar15;
              pIVar13 = pIVar13 + 2;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          goto LAB_00200c41;
        }
        fVar32 = (fVar32 - fVar37) * 0.5;
        fVar39 = fVar37 + fVar32;
        fVar38 = (*pIVar13).x;
        fVar41 = fVar39 * fVar38;
        fVar40 = (*pIVar13).y;
        fVar42 = fVar39 * fVar40;
        IVar5.y = (*points).y + fVar42;
        IVar5.x = (*points).x + fVar41;
        *pIVar9 = IVar5;
        fVar38 = fVar38 * fVar32;
        fVar40 = fVar40 * fVar32;
        IVar43.x = (*points).x + fVar38;
        IVar43.y = (*points).y + fVar40;
        pIVar9[1] = IVar43;
        IVar44.x = (*points).x - fVar38;
        IVar44.y = (*points).y - fVar40;
        pIVar9[2] = IVar44;
        IVar36.x = (*points).x - fVar41;
        IVar36.y = (*points).y - fVar42;
        pIVar9[3] = IVar36;
        uVar18 = (ulong)(uVar21 * 4);
        IVar7.y = points[uVar21].y + pIVar13[uVar21].y * fVar39;
        IVar7.x = points[uVar21].x + pIVar13[uVar21].x * fVar39;
        pIVar9[uVar18] = IVar7;
        IVar8.y = points[uVar21].y + pIVar13[uVar21].y * fVar32;
        IVar8.x = points[uVar21].x + pIVar13[uVar21].x * fVar32;
        pIVar9[uVar18 + 1] = IVar8;
        IVar6.y = points[uVar21].y - pIVar13[uVar21].y * fVar32;
        IVar6.x = points[uVar21].x - pIVar13[uVar21].x * fVar32;
        pIVar9[uVar18 + 2] = IVar6;
        IVar31.x = points[uVar21].x - pIVar13[uVar21].x * fVar39;
        IVar31.y = points[uVar21].y - pIVar13[uVar21].y * fVar39;
        pIVar9[uVar18 + 3] = IVar31;
      }
      else {
        if (thickness <= fVar37 || bVar16 != 0) {
          if (bVar16 != 0) {
            fVar37 = fVar32 * 0.5 + 1.0;
          }
          goto LAB_00200625;
        }
        fVar32 = (fVar32 - fVar37) * 0.5;
      }
      uVar18 = 1;
      uVar21 = this->_VtxCurrentIdx;
      do {
        uVar22 = uVar18 & 0xffffffff;
        if (uVar10 == uVar18) {
          uVar22 = 0;
        }
        uVar27 = uVar21 + 4;
        if (uVar10 == uVar18) {
          uVar27 = this->_VtxCurrentIdx;
        }
        fVar39 = (pIVar13[uVar22].x + pIVar13[uVar18 - 1].x) * 0.5;
        fVar38 = (pIVar13[uVar22].y + pIVar13[uVar18 - 1].y) * 0.5;
        fVar40 = fVar39 * fVar39 + fVar38 * fVar38;
        if (1e-06 < fVar40) {
          fVar40 = 1.0 / fVar40;
          fVar41 = 100.0;
          if (fVar40 <= 100.0) {
            fVar41 = fVar40;
          }
          fVar39 = fVar39 * fVar41;
          fVar38 = fVar38 * fVar41;
        }
        fVar40 = (fVar37 + fVar32) * fVar39;
        fVar41 = (fVar37 + fVar32) * fVar38;
        uVar19 = (ulong)(uint)((int)uVar22 * 4);
        pIVar9[uVar19].x = points[uVar22].x + fVar40;
        pIVar9[uVar19].y = points[uVar22].y + fVar41;
        pIVar9[uVar19 + 1].x = points[uVar22].x + fVar32 * fVar39;
        pIVar9[uVar19 + 1].y = points[uVar22].y + fVar38 * fVar32;
        pIVar9[uVar19 + 2].x = points[uVar22].x - fVar32 * fVar39;
        pIVar9[uVar19 + 2].y = points[uVar22].y - fVar38 * fVar32;
        pIVar9[uVar19 + 3].x = points[uVar22].x - fVar40;
        pIVar9[uVar19 + 3].y = points[uVar22].y - fVar41;
        IVar20 = (ImDrawIdx)uVar27;
        IVar24 = IVar20 + 1;
        *this->_IdxWritePtr = IVar24;
        IVar23 = (ImDrawIdx)uVar21;
        this->_IdxWritePtr[1] = IVar23 + 1;
        IVar17 = IVar23 + 2;
        this->_IdxWritePtr[2] = IVar17;
        this->_IdxWritePtr[3] = IVar17;
        IVar29 = IVar20 + 2;
        this->_IdxWritePtr[4] = IVar29;
        this->_IdxWritePtr[5] = IVar24;
        this->_IdxWritePtr[6] = IVar24;
        this->_IdxWritePtr[7] = IVar23 + 1;
        this->_IdxWritePtr[8] = IVar23;
        this->_IdxWritePtr[9] = IVar23;
        this->_IdxWritePtr[10] = IVar20;
        this->_IdxWritePtr[0xb] = IVar24;
        this->_IdxWritePtr[0xc] = IVar29;
        this->_IdxWritePtr[0xd] = IVar17;
        this->_IdxWritePtr[0xe] = IVar23 + 3;
        this->_IdxWritePtr[0xf] = IVar23 + 3;
        this->_IdxWritePtr[0x10] = IVar20 + 3;
        this->_IdxWritePtr[0x11] = IVar29;
        this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
        bVar30 = uVar18 != uVar28;
        uVar18 = uVar18 + 1;
        uVar21 = uVar27;
      } while (bVar30);
      pIVar15 = this->_VtxWritePtr;
      pIVar13 = pIVar13 + uVar10 + 3;
      do {
        pIVar15->pos = pIVar13[-3];
        this->_VtxWritePtr->uv = IVar2;
        this->_VtxWritePtr->col = uVar26;
        this->_VtxWritePtr[1].pos = pIVar13[-2];
        this->_VtxWritePtr[1].uv = IVar2;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos = pIVar13[-1];
        this->_VtxWritePtr[2].uv = IVar2;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos = *pIVar13;
        this->_VtxWritePtr[3].uv = IVar2;
        this->_VtxWritePtr[3].col = uVar26;
        pIVar15 = this->_VtxWritePtr + 4;
        this->_VtxWritePtr = pIVar15;
        pIVar13 = pIVar13 + 4;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
LAB_00200c41:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (vtx_count & 0xffff);
    }
  }
  return;
LAB_002007d8:
  uVar18 = uVar18 + 1;
  uVar21 = uVar27;
  goto LAB_0020064e;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}